

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_bpf_get_heap_layout(ma_bpf_config *pConfig,ma_bpf_heap_layout *pHeapLayout)

{
  ma_result mVar1;
  ulong uVar2;
  uint uVar3;
  double __x;
  
  if (pHeapLayout == (ma_bpf_heap_layout *)0x0) {
    __assert_fail("pHeapLayout != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                  ,0xb92e,
                  "ma_result ma_bpf_get_heap_layout(const ma_bpf_config *, ma_bpf_heap_layout *)");
  }
  pHeapLayout->sizeInBytes = 0;
  pHeapLayout->bpf2Offset = 0;
  mVar1 = MA_INVALID_ARGS;
  if ((pConfig != (ma_bpf_config *)0x0) && ((pConfig->order & 1) == 0 && pConfig->order < 9)) {
    uVar3 = pConfig->channels;
    pHeapLayout->sizeInBytes = 0;
    pHeapLayout->bpf2Offset = 0;
    if (1 < uVar3) {
      uVar3 = uVar3 >> 1;
      do {
        uVar2 = (ulong)pConfig->channels;
        __x = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
        sin(__x);
        sin(1.5707963267948966 - __x);
        if (uVar2 == 0) {
          return (uint)(uVar2 != 0) * 2 + MA_INVALID_ARGS;
        }
        pHeapLayout->sizeInBytes = pHeapLayout->sizeInBytes + uVar2 * 8 + 0x40;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    pHeapLayout->sizeInBytes = pHeapLayout->sizeInBytes + 7 & 0xfffffffffffffff8;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

static ma_result ma_bpf_get_heap_layout(const ma_bpf_config* pConfig, ma_bpf_heap_layout* pHeapLayout)
{
    ma_result result;
    ma_uint32 bpf2Count;
    ma_uint32 ibpf2;

    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    /* We must have an even number of order. */
    if ((pConfig->order & 0x1) != 0) {
        return MA_INVALID_ARGS;
    }

    bpf2Count = pConfig->channels / 2;

    pHeapLayout->sizeInBytes = 0;

    /* BPF 2 */
    pHeapLayout->bpf2Offset = pHeapLayout->sizeInBytes;
    for (ibpf2 = 0; ibpf2 < bpf2Count; ibpf2 += 1) {
        size_t bpf2HeapSizeInBytes;
        ma_bpf2_config bpf2Config = ma_bpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, 0.707107);   /* <-- The "q" parameter does not matter for the purpose of calculating the heap size. */

        result = ma_bpf2_get_heap_size(&bpf2Config, &bpf2HeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->sizeInBytes += sizeof(ma_bpf2) + bpf2HeapSizeInBytes;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}